

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emoticon.cpp
# Opt level: O2

void __thiscall CEmoticon::OnRender(CEmoticon *this)

{
  vec2 *v;
  undefined4 uVar1;
  undefined8 uVar2;
  CGameClient *pCVar3;
  CNetObj_GameData *pCVar4;
  IGraphics *pIVar5;
  vec2 vVar6;
  vector2_base<float> vVar7;
  int iVar8;
  CUIRect *pCVar9;
  int i;
  int iVar10;
  long in_FS_OFFSET;
  bool bVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_88;
  undefined8 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pCVar3 = (this->super_CComponent).m_pClient;
  if (2 < pCVar3->m_pClient->m_State) {
    if (this->m_Active == false) {
      if ((this->m_WasActive == true) && (this->m_SelectedEmote != -1)) {
        Emote(this,this->m_SelectedEmote);
      }
      this->m_WasActive = false;
      goto LAB_0013900c;
    }
    if (((pCVar3->m_Snap).m_SpecInfo.m_Active == false) &&
       ((pCVar4 = (pCVar3->m_Snap).m_pGameData, pCVar4 == (CNetObj_GameData *)0x0 ||
        ((pCVar4->m_GameStateFlags & 8) == 0)))) {
      this->m_WasActive = true;
      v = &this->m_SelectorMouse;
      fVar13 = (this->m_SelectorMouse).field_0.x;
      fVar15 = (this->m_SelectorMouse).field_1.y;
      if (170.0 < SQRT(fVar13 * fVar13 + fVar15 * fVar15)) {
        vVar7 = normalize(v);
        vVar6.field_1.y = vVar7.field_1.y * 170.0;
        vVar6.field_0.x = vVar7.field_0.x * 170.0;
        *v = vVar6;
      }
      fVar12 = angle(v);
      fVar13 = (this->m_SelectorMouse).field_0.x;
      fVar15 = (this->m_SelectorMouse).field_1.y;
      if (SQRT(fVar13 * fVar13 + fVar15 * fVar15) <= 110.0) {
        iVar8 = -1;
      }
      else {
        fVar12 = fVar12 + 0.2617994;
        iVar8 = (int)(((float)(~-(uint)(fVar12 < 0.0) & (uint)fVar12 |
                              (uint)(fVar12 + 6.2831855) & -(uint)(fVar12 < 0.0)) / 6.2831855) *
                     16.0);
      }
      this->m_SelectedEmote = iVar8;
      pCVar9 = CUI::Screen(&((this->super_CComponent).m_pClient)->m_UI);
      uVar2._0_4_ = pCVar9->w;
      uVar2._4_4_ = pCVar9->h;
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[5])
                (pCVar9->x,pCVar9->y,uVar2,uVar2._4_4_);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[8])()
      ;
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])(pIVar5,0xffffffffffffffff);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x21]
      )(0,0);
      fVar13 = (float)(undefined4)uVar2 * 0.5;
      fVar15 = (float)uVar2._4_4_ * 0.5;
      DrawCircle(this,fVar13,fVar15,190.0,0x40);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
      (*(pIVar5->super_IInterface)._vptr_IInterface[0x13])
                (pIVar5,(ulong)(uint)g_pData->m_aImages[6].m_Id.m_Id);
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x17]
      )();
      iVar10 = 0;
      iVar8 = 0x10;
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        fVar12 = (float)iVar10 * 6.2831855 * 0.0625;
        fVar14 = (float)(~-(uint)(3.1415927 < fVar12) & (uint)fVar12 |
                        (uint)(fVar12 + -6.2831855) & -(uint)(3.1415927 < fVar12));
        uVar1 = *(undefined4 *)(&DAT_001c9970 + (ulong)(this->m_SelectedEmote == iVar10) * 4);
        fVar12 = cosf(fVar14);
        fVar14 = sinf(fVar14);
        CRenderTools::SelectSprite
                  (&((this->super_CComponent).m_pClient)->m_RenderTools,iVar10 + 0x5c,0,0,0);
        local_48 = CONCAT44(fVar14 * 150.0 + fVar15,fVar12 * 150.0 + fVar13);
        pIVar5 = ((this->super_CComponent).m_pClient)->m_pGraphics;
        local_40 = uVar1;
        local_3c = uVar1;
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x1c])(pIVar5,&local_48,1);
        iVar10 = iVar10 + 1;
      }
      (*(((this->super_CComponent).m_pClient)->m_pGraphics->super_IInterface)._vptr_IInterface[0x18]
      )();
      CRenderTools::RenderCursor
                (&((this->super_CComponent).m_pClient)->m_RenderTools,
                 (this->m_SelectorMouse).field_0.x + fVar13,
                 (this->m_SelectorMouse).field_1.y + fVar15,24.0);
      goto LAB_0013900c;
    }
  }
  this->m_WasActive = false;
  this->m_Active = false;
LAB_0013900c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CEmoticon::OnRender()
{
	if(Client()->State() < IClient::STATE_ONLINE)
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	if(!m_Active)
	{
		if(m_WasActive && m_SelectedEmote != -1)
			Emote(m_SelectedEmote);
		m_WasActive = false;
		return;
	}

	if(m_pClient->m_Snap.m_SpecInfo.m_Active || (m_pClient->m_Snap.m_pGameData && m_pClient->m_Snap.m_pGameData->m_GameStateFlags&GAMESTATEFLAG_GAMEOVER))
	{
		m_Active = false;
		m_WasActive = false;
		return;
	}

	m_WasActive = true;

	if (length(m_SelectorMouse) > 170.0f)
		m_SelectorMouse = normalize(m_SelectorMouse) * 170.0f;

	float SelectedAngle = angle(m_SelectorMouse) + 2*pi/24;
	if (SelectedAngle < 0)
		SelectedAngle += 2*pi;

	if (length(m_SelectorMouse) > 110.0f)
		m_SelectedEmote = (int)(SelectedAngle / (2*pi) * NUM_EMOTICONS);
	else
		m_SelectedEmote = -1;

	CUIRect Screen = *UI()->Screen();

	Graphics()->MapScreen(Screen.x, Screen.y, Screen.w, Screen.h);

	Graphics()->BlendNormal();

	Graphics()->TextureClear();
	Graphics()->QuadsBegin();
	Graphics()->SetColor(0,0,0,0.3f);
	DrawCircle(Screen.w/2, Screen.h/2, 190.0f, 64);
	Graphics()->QuadsEnd();

	Graphics()->TextureSet(g_pData->m_aImages[IMAGE_EMOTICONS].m_Id);
	Graphics()->QuadsBegin();

	for (int i = 0; i < NUM_EMOTICONS; i++)
	{
		float Angle = 2*pi*i/NUM_EMOTICONS;
		if (Angle > pi)
			Angle -= 2*pi;

		bool Selected = m_SelectedEmote == i;

		float Size = Selected ? 80.0f : 50.0f;

		float NudgeX = 150.0f * cosf(Angle);
		float NudgeY = 150.0f * sinf(Angle);
		RenderTools()->SelectSprite(SPRITE_OOP + i);
		IGraphics::CQuadItem QuadItem(Screen.w/2 + NudgeX, Screen.h/2 + NudgeY, Size, Size);
		Graphics()->QuadsDraw(&QuadItem, 1);
	}

	Graphics()->QuadsEnd();

	RenderTools()->RenderCursor(m_SelectorMouse.x + Screen.w/2, m_SelectorMouse.y + Screen.h/2, 24.0f);
}